

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O0

e_ply_storage_mode ply_arch_endian(void)

{
  uchar *s;
  unsigned_long i;
  
  return PLY_LITTLE_ENDIAN;
}

Assistant:

static e_ply_storage_mode ply_arch_endian(void) {
    unsigned long i = 1;
    unsigned char *s = (unsigned char *)&i;
    if (*s == 1)
        return PLY_LITTLE_ENDIAN;
    else
        return PLY_BIG_ENDIAN;
}